

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

bool __thiscall QAbstractItemView::event(QAbstractItemView *this,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  QAbstractItemViewPrivate *pQVar3;
  QEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QModelIndex current;
  QEvent *in_stack_00000090;
  QAbstractScrollArea *in_stack_00000098;
  QWidget *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffc0;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QAbstractItemView *)0x80387f);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == FocusOut) {
    QAbstractItemViewPrivate::checkPersistentEditorFocus
              ((QAbstractItemViewPrivate *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  }
  else if (TVar2 == Paint) {
    QAbstractItemViewPrivate::executePostedLayout
              ((QAbstractItemViewPrivate *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  }
  else if (TVar2 == Show) {
    QAbstractItemViewPrivate::executePostedLayout
              ((QAbstractItemViewPrivate *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    if ((pQVar3->shouldScrollToCurrentOnShow & 1U) != 0) {
      pQVar3->shouldScrollToCurrentOnShow = false;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      currentIndex((QAbstractItemView *)CONCAT44(TVar2,in_stack_ffffffffffffffc0));
      bVar1 = QModelIndex::isValid
                        ((QModelIndex *)
                         CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      if ((bVar1) && ((pQVar3->state == EditingState || ((pQVar3->autoScroll & 1U) != 0)))) {
        (**(code **)(*in_RDI + 0x1e8))(in_RDI,&local_20,0);
      }
    }
  }
  else {
    if (TVar2 != ApplicationLayoutDirectionChange) {
      if (TVar2 == LocaleChange) {
        QAbstractScrollArea::viewport
                  ((QAbstractScrollArea *)
                   CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
        QWidget::update(in_stack_ffffffffffffffa8);
        goto LAB_00803a35;
      }
      if (TVar2 != LayoutDirectionChange) {
        if (TVar2 == FontChange) {
          QAbstractItemViewPrivate::doDelayedItemsLayout
                    ((QAbstractItemViewPrivate *)CONCAT44(0x61,in_stack_ffffffffffffffc0),
                     (int)((ulong)in_RDI >> 0x20));
        }
        else if (TVar2 == StyleChange) {
          (**(code **)(*in_RDI + 0x220))();
          if ((pQVar3->verticalScrollModeSet & 1U) == 0) {
            resetVerticalScrollMode
                      ((QAbstractItemView *)
                       CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
          }
          if ((pQVar3->horizontalScrollModeSet & 1U) == 0) {
            resetHorizontalScrollMode
                      ((QAbstractItemView *)
                       CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
          }
        }
        goto LAB_00803a35;
      }
    }
    (**(code **)(*in_RDI + 0x268))();
  }
LAB_00803a35:
  bVar1 = QAbstractScrollArea::event(in_stack_00000098,in_stack_00000090);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QAbstractItemView::event(QEvent *event)
{
    Q_D(QAbstractItemView);
    switch (event->type()) {
    case QEvent::Paint:
        //we call this here because the scrollbars' visibility might be altered
        //so this can't be done in the paintEvent method
        d->executePostedLayout(); //make sure we set the layout properly
        break;
    case QEvent::Show:
        d->executePostedLayout(); //make sure we set the layout properly
        if (d->shouldScrollToCurrentOnShow) {
            d->shouldScrollToCurrentOnShow = false;
            const QModelIndex current = currentIndex();
            if (current.isValid() && (d->state == QAbstractItemView::EditingState || d->autoScroll))
                scrollTo(current);
        }
        break;
    case QEvent::LocaleChange:
        viewport()->update();
        break;
    case QEvent::LayoutDirectionChange:
    case QEvent::ApplicationLayoutDirectionChange:
        updateGeometries();
        break;
    case QEvent::StyleChange:
        doItemsLayout();
        if (!d->verticalScrollModeSet)
            resetVerticalScrollMode();
        if (!d->horizontalScrollModeSet)
            resetHorizontalScrollMode();
        break;
    case QEvent::FocusOut:
        d->checkPersistentEditorFocus();
        break;
    case QEvent::FontChange:
        d->doDelayedItemsLayout(); // the size of the items will change
        break;
    default:
        break;
    }
    return QAbstractScrollArea::event(event);
}